

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
chaiscript::json::JSON::JSON<std::__cxx11::string>
          (JSON *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          type *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,s);
  std::
  variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
  ::variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
              *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit JSON(T s, typename enable_if<is_convertible<T, std::string>::value>::type * = nullptr)
        : internal(static_cast<std::string>(s)) {
    }